

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_privkey.cc
# Opt level: O0

char * SSL_get_signature_algorithm_name(uint16_t sigalg,int include_curve)

{
  SignatureAlgorithmName *candidate;
  SignatureAlgorithmName *__end1;
  SignatureAlgorithmName *__begin1;
  SignatureAlgorithmName (*__range1) [14];
  int include_curve_local;
  uint16_t sigalg_local;
  
  if (include_curve == 0) {
    if (sigalg == 0x403) {
      _include_curve_local = "ecdsa_sha256";
      return _include_curve_local;
    }
    if (sigalg == 0x503) {
      _include_curve_local = "ecdsa_sha384";
      return _include_curve_local;
    }
    if (sigalg == 0x603) {
      _include_curve_local = "ecdsa_sha512";
      return _include_curve_local;
    }
  }
  __end1 = kSignatureAlgorithmNames;
  while( true ) {
    if (__end1 == (SignatureAlgorithmName *)&DAT_004f168c) {
      return (char *)0x0;
    }
    if (__end1->signature_algorithm == sigalg) break;
    __end1 = __end1 + 1;
  }
  return __end1->name;
}

Assistant:

const char *SSL_get_signature_algorithm_name(uint16_t sigalg,
                                             int include_curve) {
  if (!include_curve) {
    switch (sigalg) {
      case SSL_SIGN_ECDSA_SECP256R1_SHA256:
        return "ecdsa_sha256";
      case SSL_SIGN_ECDSA_SECP384R1_SHA384:
        return "ecdsa_sha384";
      case SSL_SIGN_ECDSA_SECP521R1_SHA512:
        return "ecdsa_sha512";
        // If adding more here, also update
        // |SSL_get_all_signature_algorithm_names|.
    }
  }

  for (const auto &candidate : kSignatureAlgorithmNames) {
    if (candidate.signature_algorithm == sigalg) {
      return candidate.name;
    }
  }

  return NULL;
}